

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade.c
# Opt level: O0

int fade_segment_mix(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  double local_a0;
  double local_90;
  float fade_1;
  float x_1;
  uint32_t i_1;
  float fade;
  float x;
  uint32_t i;
  float *out;
  float *in;
  mixed_buffer *__out;
  mixed_buffer *__in;
  code *pcStack_40;
  uint32_t samples;
  _func_float_float *ease;
  double sampletime;
  float local_28;
  float range;
  float from;
  float endtime;
  double time;
  fade_segment_data *data;
  mixed_segment *segment_local;
  
  time = (double)segment->data;
  _from = (double)*(float *)((long)time + 0x24);
  range = *(float *)((long)time + 0x18);
  local_28 = *(float *)((long)time + 0x10);
  sampletime._4_4_ = *(float *)((long)time + 0x14) - *(float *)((long)time + 0x10);
  ease = (_func_float_float *)(double)(1.0 / (float)*(uint *)((long)time + 0x20));
  switch(*(undefined4 *)((long)time + 0x1c)) {
  case 1:
    pcStack_40 = fade_linear;
    break;
  case 2:
    pcStack_40 = fade_cubic_in;
    break;
  case 3:
    pcStack_40 = fade_cubic_out;
    break;
  case 4:
    pcStack_40 = fade_cubic_in_out;
    break;
  default:
    pcStack_40 = fade_linear;
  }
  __in._4_4_ = -NAN;
  __out = *(mixed_buffer **)time;
  in = *(float **)((long)time + 8);
  data = (fade_segment_data *)segment;
  if (__out == (mixed_buffer *)in) {
    mixed_buffer_request_read(&out,(uint32_t *)((long)&__in + 4),__out);
    _x = out;
    for (fade = 0.0; fVar1 = local_28, (uint)fade < (uint)__in._4_4_; fade = (float)((int)fade + 1))
    {
      if ((double)range <= _from) {
        local_90 = 1.0;
      }
      else {
        local_90 = _from / (double)range;
      }
      fVar2 = (float)(*pcStack_40)((float)local_90);
      _x[(uint)fade] = out[(uint)fade] * (fVar2 * sampletime._4_4_ + fVar1);
      _from = (double)ease + _from;
    }
  }
  else {
    mixed_buffer_request_read(&out,(uint32_t *)((long)&__in + 4),__out);
    mixed_buffer_request_write((float **)&x,(uint32_t *)((long)&__in + 4),(mixed_buffer *)in);
    for (fade_1 = 0.0; fVar1 = local_28, (uint)fade_1 < (uint)__in._4_4_;
        fade_1 = (float)((int)fade_1 + 1)) {
      if ((double)range <= _from) {
        local_a0 = 1.0;
      }
      else {
        local_a0 = _from / (double)range;
      }
      fVar2 = (float)(*pcStack_40)((float)local_a0);
      _x[(uint)fade_1] = out[(uint)fade_1] * (fVar2 * sampletime._4_4_ + fVar1);
      _from = (double)ease + _from;
    }
    mixed_buffer_finish_read((uint32_t)__in._4_4_,__out);
    mixed_buffer_finish_write((uint32_t)__in._4_4_,(mixed_buffer *)in);
  }
  *(float *)((long)time + 0x24) = (float)_from;
  return 1;
}

Assistant:

VECTORIZE int fade_segment_mix(struct mixed_segment *segment){
  struct fade_segment_data *data = (struct fade_segment_data *)segment->data;

  double time = data->time_passed;
  float endtime = data->time;
  float from = data->from;
  float range = data->to - data->from;
  double sampletime = 1.0f/data->samplerate;
  
  float (*ease)(float x);
  switch(data->type){
  case MIXED_LINEAR: ease = fade_linear; break;
  case MIXED_CUBIC_IN: ease = fade_cubic_in; break;
  case MIXED_CUBIC_OUT: ease = fade_cubic_out; break;
  case MIXED_CUBIC_IN_OUT: ease = fade_cubic_in_out; break;
  default: ease = fade_linear; break;
  }
  
  // NOTE: You could probably get away with having the same fade factor
  //       for the entirety of the sample range if the total duration
  //       of the buffer is small enough (~1ms?) as the human ear
  //       wouldn't be able to properly notice it.
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float x = (time < endtime)? time/endtime : 1.0f;
      float fade = from+ease(x)*range;
      out[i] = in[i]*fade;
      time += sampletime;
    });
  data->time_passed = time;
  return 1;
}